

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_concurrent_index.cpp
# Opt level: O2

void CheckConstraintViolation(string *result_str)

{
  long lVar1;
  ReusableStringStream local_a8;
  string local_88;
  AssertionHandler catchAssertionHandler;
  StringRef local_20;
  
  lVar1 = std::__cxx11::string::find((char *)result_str,0x472663);
  if (lVar1 == -1) {
    lVar1 = std::__cxx11::string::find((char *)result_str,0x47266a);
    if (lVar1 == -1) {
      local_88._M_dataplus._M_p = "FAIL";
      local_88._M_string_length = 4;
      local_a8.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x471750;
      local_a8.m_index = 0x1b;
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_88,(SourceLineInfo *)&local_a8,
                 (StringRef)ZEXT816(0x484131),Normal);
      local_a8.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x0;
      local_a8.m_index = 0;
      local_a8.m_oss = (ostream *)0x0;
      Catch::ReusableStringStream::ReusableStringStream(&local_a8);
      std::operator<<(local_a8.m_oss,(string *)result_str);
      Catch::ReusableStringStream::str_abi_cxx11_(&local_88,&local_a8);
      local_20.m_start = local_88._M_dataplus._M_p;
      local_20.m_size = local_88._M_string_length;
      Catch::AssertionHandler::handleMessage(&catchAssertionHandler,ExplicitFailure,&local_20);
      std::__cxx11::string::~string((string *)&local_88);
      Catch::ReusableStringStream::~ReusableStringStream(&local_a8);
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
    }
  }
  return;
}

Assistant:

static void CheckConstraintViolation(const string &result_str) {
	auto constraint_violation =
	    result_str.find("violat") != string::npos || result_str.find("Conflict on tuple deletion") != string::npos;
	if (!constraint_violation) {
		FAIL(result_str);
	}
}